

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::MultiTexShader::MultiTexShader
          (MultiTexShader *this,deUint32 randSeed,int numUnits,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *unitTypes,
          vector<glu::DataType,_std::allocator<glu::DataType>_> *samplerTypes,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *texScales,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *texBiases,
          vector<int,_std::allocator<int>_> *num2dArrayLayers)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *this_01;
  vector<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
  *this_02;
  uint uVar1;
  deBool dVar2;
  deUint32 dVar3;
  float *pfVar4;
  Vector<float,_3> *pVVar5;
  ShaderProgramDeclaration *pSVar6;
  Vector<float,_4> *pVVar7;
  float *pfVar8;
  Vector<float,_3> *pVVar9;
  undefined1 *puVar10;
  long lVar11;
  Vector<float,_3> *pVVar12;
  float *pfVar13;
  long lVar14;
  int i;
  ulong uVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float __x;
  float planarTransData [9];
  Mat3 planarTrans;
  Mat4 planarTrans4x4;
  Random rnd;
  Mat4 transformation;
  int local_544;
  Matrix<float,_4,_4> local_518;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *local_4d0;
  Matrix<float,_4,_4> local_4c8;
  Matrix<float,_4,_4> local_488;
  Mat3 local_448;
  ulong local_408;
  undefined8 uStack_400;
  float local_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  Matrix<float,_3,_3> local_3c8;
  Matrix<float,_3,_3> local_398;
  Matrix<float,_3,_3> local_368;
  Matrix<float,_3,_3> local_338;
  Matrix<float,_3,_3> local_308;
  Matrix<float,_3,_3> local_2d8;
  Matrix<float,_3,_3> local_2a8;
  deRandom local_278;
  undefined1 local_268 [16];
  float local_258 [14];
  Matrix<float,_3,_3> local_220;
  Matrix<float,_3,_3> local_1fc;
  Matrix<float,_3,_3> local_1d8;
  Matrix<float,_3,_3> local_1b4;
  Matrix<float,_3,_3> local_190;
  Matrix<float,_3,_3> local_16c;
  ShaderProgramDeclaration local_148;
  
  generateShaderProgramDeclaration(&local_148,numUnits,unitTypes,samplerTypes);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,&local_148);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_148);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_021383d8;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_02138410;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_02138428;
  *(int *)&(this->super_ShaderProgram).field_0x154 = numUnits;
  this_00 = &this->m_unitTypes;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(this_00,unitTypes);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&this->m_texScales,texScales);
  local_4d0 = &this->m_texBiases;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (local_4d0,texBiases);
  this_01 = &this->m_transformations;
  this_02 = &this->m_lodDerivateParts;
  (this->m_lodDerivateParts).
  super__Vector_base<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_lodDerivateParts).
  super__Vector_base<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_transformations).
  super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_lodDerivateParts).
  super__Vector_base<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_transformations).
  super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_transformations).
  super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  deRandom_init(&local_278,randSeed);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::reserve
            (this_01,(long)*(int *)&(this->super_ShaderProgram).field_0x154);
  std::
  vector<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
  ::reserve(this_02,(long)*(int *)&(this->super_ShaderProgram).field_0x154);
  if (0 < *(int *)&(this->super_ShaderProgram).field_0x154) {
    lVar16 = 0;
    local_544 = 0;
    do {
      uVar1 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar16];
      if (uVar1 == 0x8513) {
        uVar15 = 0;
        do {
          if ((uVar15 & 0xb) == 0) {
            fVar17 = deRandom_getFloat(&local_278);
            fVar17 = fVar17 * 0.79999995 + 0.1;
          }
          else {
            fVar17 = 0.0;
            if (uVar15 == 8) {
              local_518.m_data.m_data[2].m_data[0] = 1.0;
              break;
            }
          }
          local_518.m_data.m_data[0].m_data[uVar15] = fVar17;
          uVar15 = uVar15 + 1;
        } while (uVar15 != 9);
        dVar3 = deRandom_getUint32(&local_278);
        local_448.m_data.m_data[1].m_data[1] = 0.0;
        local_448.m_data.m_data[1].m_data[2] = 0.0;
        local_448.m_data.m_data[2].m_data[0] = 0.0;
        local_448.m_data.m_data[2].m_data[1] = 0.0;
        local_448.m_data.m_data[0].m_data[0] = 0.0;
        local_448.m_data.m_data[0].m_data[1] = 0.0;
        local_448.m_data.m_data[0].m_data[2] = 0.0;
        local_448.m_data.m_data[1].m_data[0] = 0.0;
        local_448.m_data.m_data[2].m_data[2] = 0.0;
        pfVar4 = (float *)&local_518;
        pVVar5 = (Vector<float,_3> *)&local_448;
        lVar11 = 0;
        do {
          lVar14 = 0;
          pVVar9 = pVVar5;
          do {
            ((Vector<tcu::Vector<float,_3>,_3> *)pVVar9->m_data)->m_data[0].m_data[0] =
                 pfVar4[lVar14];
            lVar14 = lVar14 + 1;
            pVVar9 = pVVar9 + 1;
          } while (lVar14 != 3);
          lVar11 = lVar11 + 1;
          pVVar5 = (Vector<float,_3> *)(pVVar5->m_data + 1);
          pfVar4 = pfVar4 + 3;
        } while (lVar11 != 3);
        pfVar4 = MultiTexShader::s_cubeTransforms[dVar3 % 6];
        local_488.m_data.m_data[1].m_data[0] = 0.0;
        local_488.m_data.m_data[1].m_data[1] = 0.0;
        local_488.m_data.m_data[1].m_data[2] = 0.0;
        local_488.m_data.m_data[1].m_data[3] = 0.0;
        local_488.m_data.m_data[0].m_data[0] = 0.0;
        local_488.m_data.m_data[0].m_data[1] = 0.0;
        local_488.m_data.m_data[0].m_data[2] = 0.0;
        local_488.m_data.m_data[0].m_data[3] = 0.0;
        local_488.m_data.m_data[2].m_data[0] = 0.0;
        pfVar8 = (float *)&local_488;
        lVar11 = 0;
        do {
          lVar14 = 0;
          pfVar13 = pfVar8;
          do {
            *pfVar13 = pfVar4[lVar14];
            lVar14 = lVar14 + 1;
            pfVar13 = pfVar13 + 3;
          } while (lVar14 != 3);
          lVar11 = lVar11 + 1;
          pfVar8 = pfVar8 + 1;
          pfVar4 = pfVar4 + 3;
        } while (lVar11 != 3);
        tcu::operator*((Matrix<float,_3,_3> *)&local_408,(Matrix<float,_3,_3> *)&local_488,
                       &local_448);
        matExtend3To4((Mat4 *)&local_148,(Mat3 *)&local_408);
        matExtend3To4((Mat4 *)&local_408,&local_448);
        calculateLodDerivateParts((Vector<tcu::Vector<float,_2>,_3> *)&local_488,(Mat4 *)&local_408)
        ;
        std::
        vector<tcu::Vector<tcu::Vector<float,2>,3>,std::allocator<tcu::Vector<tcu::Vector<float,2>,3>>>
        ::emplace_back<tcu::Vector<tcu::Vector<float,2>,3>>
                  ((vector<tcu::Vector<tcu::Vector<float,2>,3>,std::allocator<tcu::Vector<tcu::Vector<float,2>,3>>>
                    *)this_02,(Vector<tcu::Vector<float,_2>,_3> *)&local_488);
        std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
                  (this_01,(value_type *)&local_148);
      }
      else if (uVar1 == 0xde1) {
        fVar17 = deRandom_getFloat(&local_278);
        fVar18 = deRandom_getFloat(&local_278);
        fVar19 = deRandom_getFloat(&local_278);
        fVar20 = deRandom_getFloat(&local_278);
        fVar21 = deRandom_getFloat(&local_278);
        fVar22 = deRandom_getFloat(&local_278);
        fVar23 = deRandom_getFloat(&local_278);
        __x = fVar17 * 6.2831855 + 0.0;
        fVar17 = cosf(__x);
        local_408 = CONCAT44(local_408._4_4_,fVar17);
        fVar17 = sinf(__x);
        local_408 = CONCAT44(fVar17,(float)local_408) ^ 0x8000000000000000;
        uStack_400 = uStack_400 & 0xffffffff00000000;
        fVar17 = sinf(__x);
        uStack_400 = CONCAT44(fVar17,(undefined4)uStack_400);
        local_3f8 = cosf(__x);
        uStack_3f4 = 0;
        uStack_3f0 = 0;
        uStack_3ec = 0;
        uStack_3e8 = 0x3f800000;
        local_518.m_data.m_data[0].m_data[0] = fVar18 * 0.8 + 0.7;
        local_518.m_data.m_data[0].m_data[1] = 0.0;
        local_518.m_data.m_data[0].m_data[2] = 0.0;
        local_518.m_data.m_data[0].m_data[3] = 0.0;
        local_518.m_data.m_data[1].m_data[0] = fVar19 * 0.8 + 0.7;
        local_518.m_data.m_data[1].m_data[1] = 0.0;
        local_518.m_data.m_data[1].m_data[2] = 0.0;
        local_518.m_data.m_data[1].m_data[3] = 0.0;
        local_518.m_data.m_data[2].m_data[0] = 1.0;
        local_448.m_data.m_data[0].m_data[1] = fVar20 * 0.5 + 0.0;
        local_448.m_data.m_data[0].m_data[0] = 1.0;
        local_448.m_data.m_data[0].m_data[2] = 0.0;
        local_448.m_data.m_data[1].m_data[0] = 0.0;
        local_448.m_data.m_data[1].m_data[1] = 1.0;
        local_448.m_data.m_data[1].m_data[2] = 0.0;
        local_448.m_data.m_data[2].m_data[0] = 0.0;
        local_448.m_data.m_data[2].m_data[1] = 0.0;
        local_448.m_data.m_data[2].m_data[2] = 1.0;
        local_488.m_data.m_data[0].m_data[0] = 1.0;
        local_488.m_data.m_data[0].m_data[1] = 0.0;
        local_488.m_data.m_data[0].m_data._8_8_ = (ulong)(uint)(fVar21 * 0.5 + 0.0) << 0x20;
        local_488.m_data.m_data[1].m_data[0] = 1.0;
        local_488.m_data.m_data[1].m_data[1] = 0.0;
        local_488.m_data.m_data[1].m_data[2] = 0.0;
        local_488.m_data.m_data[1].m_data[3] = 0.0;
        local_488.m_data.m_data[2].m_data[0] = 1.0;
        local_4c8.m_data.m_data[0].m_data[0] = 1.0;
        local_4c8.m_data.m_data[0].m_data[1] = 0.0;
        local_4c8.m_data.m_data[0].m_data[2] = fVar22 + -0.5;
        local_4c8.m_data.m_data[0].m_data[3] = 0.0;
        local_4c8.m_data.m_data[1].m_data[0] = 1.0;
        local_4c8.m_data.m_data[1].m_data[1] = fVar23 + -0.5;
        local_4c8.m_data.m_data[1].m_data[2] = 0.0;
        local_4c8.m_data.m_data[1].m_data[3] = 0.0;
        local_4c8.m_data.m_data[2].m_data[0] = 1.0;
        local_2a8.m_data.m_data[2].m_data[2] = 0.0;
        local_2a8.m_data.m_data[1].m_data[1] = 0.0;
        local_2a8.m_data.m_data[1].m_data[2] = 0.0;
        local_2a8.m_data.m_data[2].m_data[0] = 0.0;
        local_2a8.m_data.m_data[2].m_data[1] = 0.0;
        local_2a8.m_data.m_data[0].m_data[0] = 0.0;
        local_2a8.m_data.m_data[0].m_data[1] = 0.0;
        local_2a8.m_data.m_data[0].m_data[2] = 0.0;
        local_2a8.m_data.m_data[1].m_data[0] = 0.0;
        pfVar4 = MultiTexShader::tempOffsetData;
        pVVar5 = (Vector<float,_3> *)&local_2a8;
        lVar11 = 0;
        do {
          lVar14 = 0;
          pVVar9 = pVVar5;
          do {
            ((Vector<tcu::Vector<float,_3>,_3> *)pVVar9->m_data)->m_data[0].m_data[0] =
                 pfVar4[lVar14];
            lVar14 = lVar14 + 1;
            pVVar9 = pVVar9 + 1;
          } while (lVar14 != 3);
          lVar11 = lVar11 + 1;
          pVVar5 = (Vector<float,_3> *)(pVVar5->m_data + 1);
          pfVar4 = pfVar4 + 3;
        } while (lVar11 != 3);
        local_2d8.m_data.m_data[1].m_data[1] = 0.0;
        local_2d8.m_data.m_data[1].m_data[2] = 0.0;
        local_2d8.m_data.m_data[2].m_data[0] = 0.0;
        local_2d8.m_data.m_data[2].m_data[1] = 0.0;
        local_2d8.m_data.m_data[0].m_data[0] = 0.0;
        local_2d8.m_data.m_data[0].m_data[1] = 0.0;
        local_2d8.m_data.m_data[0].m_data[2] = 0.0;
        local_2d8.m_data.m_data[1].m_data[0] = 0.0;
        local_2d8.m_data.m_data[2].m_data[2] = 0.0;
        pfVar4 = (float *)&local_4c8;
        pVVar5 = (Vector<float,_3> *)&local_2d8;
        lVar11 = 0;
        do {
          lVar14 = 0;
          pVVar9 = pVVar5;
          do {
            ((Vector<tcu::Vector<float,_3>,_3> *)pVVar9->m_data)->m_data[0].m_data[0] =
                 pfVar4[lVar14];
            lVar14 = lVar14 + 1;
            pVVar9 = pVVar9 + 1;
          } while (lVar14 != 3);
          lVar11 = lVar11 + 1;
          pVVar5 = (Vector<float,_3> *)(pVVar5->m_data + 1);
          pfVar4 = pfVar4 + 3;
        } while (lVar11 != 3);
        tcu::operator*(&local_220,&local_2a8,&local_2d8);
        local_308.m_data.m_data[1].m_data[1] = 0.0;
        local_308.m_data.m_data[1].m_data[2] = 0.0;
        local_308.m_data.m_data[2].m_data[0] = 0.0;
        local_308.m_data.m_data[2].m_data[1] = 0.0;
        local_308.m_data.m_data[0].m_data[0] = 0.0;
        local_308.m_data.m_data[0].m_data[1] = 0.0;
        local_308.m_data.m_data[0].m_data[2] = 0.0;
        local_308.m_data.m_data[1].m_data[0] = 0.0;
        local_308.m_data.m_data[2].m_data[2] = 0.0;
        pVVar5 = (Vector<float,_3> *)&local_308;
        lVar11 = 0;
        pfVar4 = (float *)&local_408;
        do {
          lVar14 = 0;
          pVVar9 = pVVar5;
          do {
            ((Vector<tcu::Vector<float,_3>,_3> *)pVVar9->m_data)->m_data[0].m_data[0] =
                 pfVar4[lVar14];
            lVar14 = lVar14 + 1;
            pVVar9 = pVVar9 + 1;
          } while (lVar14 != 3);
          lVar11 = lVar11 + 1;
          pVVar5 = (Vector<float,_3> *)(pVVar5->m_data + 1);
          pfVar4 = pfVar4 + 3;
        } while (lVar11 != 3);
        tcu::operator*(&local_1fc,&local_220,&local_308);
        local_338.m_data.m_data[1].m_data[1] = 0.0;
        local_338.m_data.m_data[1].m_data[2] = 0.0;
        local_338.m_data.m_data[2].m_data[0] = 0.0;
        local_338.m_data.m_data[2].m_data[1] = 0.0;
        local_338.m_data.m_data[0].m_data[0] = 0.0;
        local_338.m_data.m_data[0].m_data[1] = 0.0;
        local_338.m_data.m_data[0].m_data[2] = 0.0;
        local_338.m_data.m_data[1].m_data[0] = 0.0;
        local_338.m_data.m_data[2].m_data[2] = 0.0;
        pfVar4 = (float *)&local_518;
        pVVar5 = (Vector<float,_3> *)&local_338;
        lVar11 = 0;
        do {
          lVar14 = 0;
          pVVar9 = pVVar5;
          do {
            ((Vector<tcu::Vector<float,_3>,_3> *)pVVar9->m_data)->m_data[0].m_data[0] =
                 pfVar4[lVar14];
            lVar14 = lVar14 + 1;
            pVVar9 = pVVar9 + 1;
          } while (lVar14 != 3);
          lVar11 = lVar11 + 1;
          pVVar5 = (Vector<float,_3> *)(pVVar5->m_data + 1);
          pfVar4 = pfVar4 + 3;
        } while (lVar11 != 3);
        tcu::operator*(&local_1d8,&local_1fc,&local_338);
        local_368.m_data.m_data[1].m_data[1] = 0.0;
        local_368.m_data.m_data[1].m_data[2] = 0.0;
        local_368.m_data.m_data[2].m_data[0] = 0.0;
        local_368.m_data.m_data[2].m_data[1] = 0.0;
        local_368.m_data.m_data[0].m_data[0] = 0.0;
        local_368.m_data.m_data[0].m_data[1] = 0.0;
        local_368.m_data.m_data[0].m_data[2] = 0.0;
        local_368.m_data.m_data[1].m_data[0] = 0.0;
        local_368.m_data.m_data[2].m_data[2] = 0.0;
        pVVar5 = (Vector<float,_3> *)&local_448;
        pVVar9 = (Vector<float,_3> *)&local_368;
        lVar11 = 0;
        do {
          lVar14 = 0;
          pVVar12 = pVVar9;
          do {
            ((Vector<tcu::Vector<float,_3>,_3> *)pVVar12->m_data)->m_data[0].m_data[0] =
                 ((Vector<tcu::Vector<float,_3>,_3> *)pVVar5->m_data)->m_data[0].m_data[lVar14];
            lVar14 = lVar14 + 1;
            pVVar12 = pVVar12 + 1;
          } while (lVar14 != 3);
          lVar11 = lVar11 + 1;
          pVVar9 = (Vector<float,_3> *)(pVVar9->m_data + 1);
          pVVar5 = pVVar5 + 1;
        } while (lVar11 != 3);
        tcu::operator*(&local_1b4,&local_1d8,&local_368);
        local_398.m_data.m_data[1].m_data[1] = 0.0;
        local_398.m_data.m_data[1].m_data[2] = 0.0;
        local_398.m_data.m_data[2].m_data[0] = 0.0;
        local_398.m_data.m_data[2].m_data[1] = 0.0;
        local_398.m_data.m_data[0].m_data[0] = 0.0;
        local_398.m_data.m_data[0].m_data[1] = 0.0;
        local_398.m_data.m_data[0].m_data[2] = 0.0;
        local_398.m_data.m_data[1].m_data[0] = 0.0;
        local_398.m_data.m_data[2].m_data[2] = 0.0;
        pfVar4 = (float *)&local_488;
        pVVar5 = (Vector<float,_3> *)&local_398;
        lVar11 = 0;
        do {
          lVar14 = 0;
          pVVar9 = pVVar5;
          do {
            ((Vector<tcu::Vector<float,_3>,_3> *)pVVar9->m_data)->m_data[0].m_data[0] =
                 pfVar4[lVar14];
            lVar14 = lVar14 + 1;
            pVVar9 = pVVar9 + 1;
          } while (lVar14 != 3);
          lVar11 = lVar11 + 1;
          pVVar5 = (Vector<float,_3> *)(pVVar5->m_data + 1);
          pfVar4 = pfVar4 + 3;
        } while (lVar11 != 3);
        tcu::operator*(&local_190,&local_1b4,&local_398);
        local_3c8.m_data.m_data[1].m_data[1] = 0.0;
        local_3c8.m_data.m_data[1].m_data[2] = 0.0;
        local_3c8.m_data.m_data[2].m_data[0] = 0.0;
        local_3c8.m_data.m_data[2].m_data[1] = 0.0;
        local_3c8.m_data.m_data[0].m_data[0] = 0.0;
        local_3c8.m_data.m_data[0].m_data[1] = 0.0;
        local_3c8.m_data.m_data[0].m_data[2] = 0.0;
        local_3c8.m_data.m_data[1].m_data[0] = 0.0;
        local_3c8.m_data.m_data[2].m_data[2] = 0.0;
        pfVar4 = MultiTexShader::tempOffsetData;
        pVVar5 = (Vector<float,_3> *)&local_3c8;
        lVar11 = 0;
        do {
          lVar14 = 0;
          pVVar9 = pVVar5;
          do {
            ((Vector<tcu::Vector<float,_3>,_3> *)pVVar9->m_data)->m_data[0].m_data[0] =
                 pfVar4[lVar14];
            lVar14 = lVar14 + 1;
            pVVar9 = pVVar9 + 1;
          } while (lVar14 != 3);
          lVar11 = lVar11 + 1;
          pVVar5 = (Vector<float,_3> *)(pVVar5->m_data + 1);
          pfVar4 = pfVar4 + 3;
        } while (lVar11 != 3);
        tcu::operator*(&local_16c,&local_3c8,-1.0);
        tcu::operator*((Matrix<float,_3,_3> *)local_268,&local_190,&local_16c);
        matExtend3To4((Mat4 *)&local_148,(Matrix<float,_3,_3> *)local_268);
        calculateLodDerivateParts((Vector<tcu::Vector<float,_2>,_3> *)local_268,(Mat4 *)&local_148);
        std::
        vector<tcu::Vector<tcu::Vector<float,2>,3>,std::allocator<tcu::Vector<tcu::Vector<float,2>,3>>>
        ::emplace_back<tcu::Vector<tcu::Vector<float,2>,3>>
                  ((vector<tcu::Vector<tcu::Vector<float,2>,3>,std::allocator<tcu::Vector<tcu::Vector<float,2>,3>>>
                    *)this_02,(Vector<tcu::Vector<float,_2>,_3> *)local_268);
        std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
                  (this_01,(value_type *)&local_148);
      }
      else {
        lVar11 = 0;
        do {
          dVar2 = deRandom_getBool(&local_278);
          fVar17 = deRandom_getFloat(&local_278);
          fVar17 = fVar17 * 0.7 + 0.7;
          if (dVar2 != 1) {
            fVar17 = -fVar17;
          }
          *(float *)((long)&local_148.m_vertexAttributes.
                            super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar11 * 4) = fVar17;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x10);
        local_3d8 = 0;
        uStack_3d0 = 0;
        uStack_3e8 = 0;
        uStack_3e4 = 0;
        uStack_3e0 = 0;
        local_3f8 = 0.0;
        uStack_3f4 = 0;
        uStack_3f0 = 0;
        uStack_3ec = 0;
        local_408 = 0;
        uStack_400 = 0;
        pSVar6 = &local_148;
        lVar11 = 0;
        pfVar4 = (float *)&local_408;
        do {
          lVar14 = 0;
          do {
            pfVar4[lVar14] =
                 *(float *)((long)&(pSVar6->m_vertexAttributes).
                                   super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar14);
            lVar14 = lVar14 + 4;
          } while (lVar14 != 0x10);
          lVar11 = lVar11 + 1;
          pfVar4 = pfVar4 + 1;
          pSVar6 = (ShaderProgramDeclaration *)
                   &(pSVar6->m_vertexAttributes).
                    super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        } while (lVar11 != 4);
        if ((this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar16] == 0x8c1a) {
          local_518.m_data.m_data[0].m_data[1] = 0.0;
          local_518.m_data.m_data[0].m_data[2] = 0.0;
          local_518.m_data.m_data[0].m_data[3] = 0.0;
          local_518.m_data.m_data[1].m_data[0] = 0.0;
          local_518.m_data.m_data[1].m_data[2] = 0.0;
          local_518.m_data.m_data[1].m_data[3] = 0.0;
          local_518.m_data.m_data[2].m_data[0] = 0.0;
          local_518.m_data.m_data[2].m_data[1] = 0.0;
          local_518.m_data.m_data[3].m_data[0] = 0.0;
          local_518.m_data.m_data[3].m_data[1] = 0.0;
          local_518.m_data.m_data[0].m_data[0] = 1.0;
          local_518.m_data.m_data[1].m_data[1] = 1.0;
          local_518.m_data.m_data[2].m_data[3] = 0.0;
          local_518.m_data.m_data[2].m_data[2] =
               (float)(num2dArrayLayers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start[local_544];
          local_518.m_data.m_data[3].m_data[2] = 0.0;
          local_518.m_data.m_data[3].m_data[3] = 1.0;
          local_4c8.m_data.m_data[3].m_data[0] = 0.0;
          local_4c8.m_data.m_data[3].m_data[1] = 0.0;
          local_4c8.m_data.m_data[3].m_data[2] = 0.0;
          local_4c8.m_data.m_data[3].m_data[3] = 0.0;
          local_4c8.m_data.m_data[2].m_data[0] = 0.0;
          local_4c8.m_data.m_data[2].m_data[1] = 0.0;
          local_4c8.m_data.m_data[2].m_data[2] = 0.0;
          local_4c8.m_data.m_data[2].m_data[3] = 0.0;
          local_4c8.m_data.m_data[1].m_data[0] = 0.0;
          local_4c8.m_data.m_data[1].m_data[1] = 0.0;
          local_4c8.m_data.m_data[1].m_data[2] = 0.0;
          local_4c8.m_data.m_data[1].m_data[3] = 0.0;
          local_4c8.m_data.m_data[0].m_data[0] = 0.0;
          local_4c8.m_data.m_data[0].m_data[1] = 0.0;
          local_4c8.m_data.m_data[0].m_data[2] = 0.0;
          local_4c8.m_data.m_data[0].m_data[3] = 0.0;
          pVVar7 = (Vector<float,_4> *)&local_518;
          pfVar4 = (float *)&local_4c8;
          lVar11 = 0;
          do {
            lVar14 = 0;
            do {
              pfVar4[lVar14] =
                   (float)*(undefined4 *)
                           ((long)((Vector<tcu::Vector<float,_4>,_4> *)pVVar7->m_data)->m_data[0].
                                  m_data + lVar14);
              lVar14 = lVar14 + 4;
            } while (lVar14 != 0x10);
            lVar11 = lVar11 + 1;
            pfVar4 = pfVar4 + 1;
            pVVar7 = pVVar7 + 1;
          } while (lVar11 != 4);
          tcu::operator*(&local_488,(Matrix<float,_4,_4> *)&local_408,&local_4c8);
          local_258[8] = 0.0;
          local_258[9] = 0.0;
          local_258[10] = 0.0;
          local_258[0xb] = 0.0;
          local_258[4] = 0.0;
          local_258[5] = 0.0;
          local_258[6] = 0.0;
          local_258[7] = 0.0;
          local_258[0] = 0.0;
          local_258[1] = 0.0;
          local_258[2] = 0.0;
          local_258[3] = 0.0;
          local_268._0_4_ = 0.0;
          local_268._4_4_ = 0.0;
          local_268._8_4_ = 0.0;
          local_268._12_4_ = 0.0;
          pfVar4 = MultiTexShader::zTranslationTransfData;
          puVar10 = local_268;
          lVar11 = 0;
          do {
            lVar14 = 0;
            do {
              *(undefined4 *)(puVar10 + lVar14 * 4) = *(undefined4 *)((long)pfVar4 + lVar14);
              lVar14 = lVar14 + 4;
            } while (lVar14 != 0x10);
            lVar11 = lVar11 + 1;
            puVar10 = puVar10 + 4;
            pfVar4 = pfVar4 + 4;
          } while (lVar11 != 4);
          pfVar4 = (float *)&local_448;
          tcu::operator*((Matrix<float,_4,_4> *)pfVar4,&local_488,(Matrix<float,_4,_4> *)local_268);
          lVar11 = 0;
          pfVar8 = (float *)&local_408;
          do {
            lVar14 = 0;
            do {
              *(undefined4 *)((long)pfVar8 + lVar14) = *(undefined4 *)((long)pfVar4 + lVar14);
              lVar14 = lVar14 + 0x10;
            } while (lVar14 != 0x40);
            lVar11 = lVar11 + 1;
            pfVar8 = pfVar8 + 1;
            pfVar4 = pfVar4 + 1;
          } while (lVar11 != 4);
          local_544 = local_544 + 1;
        }
        pfVar4 = (float *)&local_518;
        calculateLodDerivateParts((Vector<tcu::Vector<float,_2>,_3> *)pfVar4,(Mat4 *)&local_408);
        std::
        vector<tcu::Vector<tcu::Vector<float,2>,3>,std::allocator<tcu::Vector<tcu::Vector<float,2>,3>>>
        ::emplace_back<tcu::Vector<tcu::Vector<float,2>,3>>
                  ((vector<tcu::Vector<tcu::Vector<float,2>,3>,std::allocator<tcu::Vector<tcu::Vector<float,2>,3>>>
                    *)this_02,(Vector<tcu::Vector<float,_2>,_3> *)pfVar4);
        local_518.m_data.m_data[3].m_data[0] = 0.0;
        local_518.m_data.m_data[3].m_data[1] = 0.0;
        local_518.m_data.m_data[3].m_data[2] = 0.0;
        local_518.m_data.m_data[3].m_data[3] = 0.0;
        local_518.m_data.m_data[2].m_data[0] = 0.0;
        local_518.m_data.m_data[2].m_data[1] = 0.0;
        local_518.m_data.m_data[2].m_data[2] = 0.0;
        local_518.m_data.m_data[2].m_data[3] = 0.0;
        local_518.m_data.m_data[1].m_data[0] = 0.0;
        local_518.m_data.m_data[1].m_data[1] = 0.0;
        local_518.m_data.m_data[1].m_data[2] = 0.0;
        local_518.m_data.m_data[1].m_data[3] = 0.0;
        local_518.m_data.m_data[0].m_data[0] = 0.0;
        local_518.m_data.m_data[0].m_data[1] = 0.0;
        local_518.m_data.m_data[0].m_data[2] = 0.0;
        local_518.m_data.m_data[0].m_data[3] = 0.0;
        lVar11 = 0;
        pfVar8 = (float *)&local_408;
        do {
          lVar14 = 0;
          do {
            *(undefined4 *)((long)pfVar4 + lVar14) = *(undefined4 *)((long)pfVar8 + lVar14);
            lVar14 = lVar14 + 0x10;
          } while (lVar14 != 0x40);
          lVar11 = lVar11 + 1;
          pfVar4 = pfVar4 + 1;
          pfVar8 = pfVar8 + 1;
        } while (lVar11 != 4);
        std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
        emplace_back<tcu::Matrix<float,4,4>>
                  ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_01,
                   &local_518);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < *(int *)&(this->super_ShaderProgram).field_0x154);
  }
  return;
}

Assistant:

MultiTexShader::MultiTexShader (deUint32 randSeed,
								int numUnits,
								const vector<GLenum>& unitTypes,
								const vector<glu::DataType>& samplerTypes,
								const vector<Vec4>& texScales,
								const vector<Vec4>& texBiases,
								const vector<int>& num2dArrayLayers)
		: sglr::ShaderProgram	(generateShaderProgramDeclaration(numUnits, unitTypes, samplerTypes))
		, m_numUnits		(numUnits)
		, m_unitTypes		(unitTypes)
		, m_texScales		(texScales)
		, m_texBiases		(texBiases)
{
	// 2d-to-cube-face transformations.
	// \note 2d coordinates range from 0 to 1 and cube face coordinates from -1 to 1, so scaling is done as well.
	static const float s_cubeTransforms[][3*3] =
	{
		// Face -X: (x, y, 1) -> (-1, -(2*y-1), +(2*x-1))
		{  0.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f,
		   2.0f,  0.0f, -1.0f },
		// Face +X: (x, y, 1) -> (+1, -(2*y-1), -(2*x-1))
		{  0.0f,  0.0f,  1.0f,
		   0.0f, -2.0f,  1.0f,
		  -2.0f,  0.0f,  1.0f },
		// Face -Y: (x, y, 1) -> (+(2*x-1), -1, -(2*y-1))
		{  2.0f,  0.0f, -1.0f,
		   0.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f },
		// Face +Y: (x, y, 1) -> (+(2*x-1), +1, +(2*y-1))
		{  2.0f,  0.0f, -1.0f,
		   0.0f,  0.0f,  1.0f,
		   0.0f,  2.0f, -1.0f },
		// Face -Z: (x, y, 1) -> (-(2*x-1), -(2*y-1), -1)
		{ -2.0f,  0.0f,  1.0f,
		   0.0f, -2.0f,  1.0f,
		   0.0f,  0.0f, -1.0f },
		// Face +Z: (x, y, 1) -> (+(2*x-1), -(2*y-1), +1)
		{  2.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f,
		   0.0f,  0.0f,  1.0f }
	};

	// Generate transformation matrices.

	de::Random rnd(randSeed);

	m_transformations.reserve(m_numUnits);
	m_lodDerivateParts.reserve(m_numUnits);

	int tex2dArrayNdx = 0; // Keep track of 2d texture array index.

	DE_ASSERT((int)m_unitTypes.size() == m_numUnits);

	for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
	{
		if (m_unitTypes[unitNdx] == GL_TEXTURE_2D)
		{
			float rotAngle				= rnd.getFloat(0.0f, 2.0f*DE_PI);
			float xScaleFactor			= rnd.getFloat(0.7f, 1.5f);
			float yScaleFactor			= rnd.getFloat(0.7f, 1.5f);
			float xShearAmount			= rnd.getFloat(0.0f, 0.5f);
			float yShearAmount			= rnd.getFloat(0.0f, 0.5f);
			float xTranslationAmount	= rnd.getFloat(-0.5f, 0.5f);
			float yTranslationAmount	= rnd.getFloat(-0.5f, 0.5f);

			static const float tempOffsetData[3*3] = // For temporarily centering the coordinates to get nicer transformations.
			{
				1.0f,  0.0f, -0.5f,
				0.0f,  1.0f, -0.5f,
				0.0f,  0.0f,  1.0f
			};
			float rotTransfData[3*3] =
			{
				deFloatCos(rotAngle),	-deFloatSin(rotAngle),	0.0f,
				deFloatSin(rotAngle),	deFloatCos(rotAngle),	0.0f,
				0.0f,					0.0f,					1.0f
			};
			float scaleTransfData[3*3] =
			{
				xScaleFactor,	0.0f,			0.0f,
				0.0f,			yScaleFactor,	0.0f,
				0.0f,			0.0f,			1.0f
			};
			float xShearTransfData[3*3] =
			{
				1.0f,			xShearAmount,	0.0f,
				0.0f,			1.0f,			0.0f,
				0.0f,			0.0f,			1.0f
			};
			float yShearTransfData[3*3] =
			{
				1.0f,			0.0f,			0.0f,
				yShearAmount,	1.0f,			0.0f,
				0.0f,			0.0f,			1.0f
			};
			float translationTransfData[3*3] =
			{
				1.0f,	0.0f,	xTranslationAmount,
				0.0f,	1.0f,	yTranslationAmount,
				0.0f,	0.0f,	1.0f
			};

			Mat4 transformation = matExtend3To4(Mat3(tempOffsetData) *
												Mat3(translationTransfData) *
												Mat3(rotTransfData) *
												Mat3(scaleTransfData) *
												Mat3(xShearTransfData) *
												Mat3(yShearTransfData) *
												(Mat3(tempOffsetData) * (-1.0f)));

			m_lodDerivateParts.push_back(calculateLodDerivateParts(transformation));
			m_transformations.push_back(transformation);
		}
		else if (m_unitTypes[unitNdx] == GL_TEXTURE_CUBE_MAP)
		{
			DE_STATIC_ASSERT((int)tcu::CUBEFACE_LAST == DE_LENGTH_OF_ARRAY(s_cubeTransforms));

			float planarTransData[3*3];

			// In case of a cube map, we only want to render one face, so the transformation needs to be restricted - only enlarging scaling is done.

			for (int i = 0; i < DE_LENGTH_OF_ARRAY(planarTransData); i++)
			{
				if (i == 0 || i == 4)
					planarTransData[i] = rnd.getFloat(0.1f, 0.9f); // Two first diagonal cells control the scaling.
				else if (i == 8)
					planarTransData[i] = 1.0f;
				else
					planarTransData[i] = 0.0f;
			}

			int		faceNdx			= rnd.getInt(0, (int)tcu::CUBEFACE_LAST - 1);
			Mat3	planarTrans		(planarTransData);												// Planar, face-agnostic transformation.
			Mat4	finalTrans		= matExtend3To4(Mat3(s_cubeTransforms[faceNdx]) * planarTrans);	// Final transformation from planar to cube map coordinates, including the transformation just generated.
			Mat4	planarTrans4x4	= matExtend3To4(planarTrans);

			m_lodDerivateParts.push_back(calculateLodDerivateParts(planarTrans4x4));
			m_transformations.push_back(finalTrans);
		}
		else
		{
			DE_ASSERT(m_unitTypes[unitNdx] == GL_TEXTURE_3D || m_unitTypes[unitNdx] == GL_TEXTURE_2D_ARRAY);

			float transData[4*4];

			for (int i = 0; i < 4*4; i++)
			{
				float sign = rnd.getBool() ? 1.0f : -1.0f;
				transData[i] = rnd.getFloat(0.7f, 1.4f) * sign;
			}

			Mat4 transformation(transData);

			if (m_unitTypes[unitNdx] == GL_TEXTURE_2D_ARRAY)
			{
				// Z direction: Translate by 0.5 and scale by layer amount.

				float numLayers = (float)num2dArrayLayers[tex2dArrayNdx];

				static const float zTranslationTransfData[4*4] =
				{
					1.0f, 0.0f, 0.0f, 0.0f,
					0.0f, 1.0f, 0.0f, 0.0f,
					0.0f, 0.0f, 1.0f, 0.5f,
					0.0f, 0.0f, 0.0f, 1.0f
				};

				float zScaleTransfData[4*4] =
				{
					1.0f,		0.0f,		0.0f,		0.0f,
					0.0f,		1.0f,		0.0f,		0.0f,
					0.0f,		0.0f,		numLayers,	0.0f,
					0.0f,		0.0f,		0.0f,		1.0f
				};

				transformation = transformation * Mat4(zScaleTransfData) * Mat4(zTranslationTransfData);

				tex2dArrayNdx++;
			}

			m_lodDerivateParts.push_back(calculateLodDerivateParts(transformation));
			m_transformations.push_back(Mat4(transformation));
		}
	}
}